

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O3

int mmu_translate(CPUS390XState_conflict *env,target_ulong vaddr,int rw,uint64_t asc,
                 target_ulong *raddr,int *flags,uint64_t *tec)

{
  FlatView *pFVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  _Bool _Var8;
  MemTxResult MVar9;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  MemoryRegion_conflict *pMVar10;
  ulong *puVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  long lVar18;
  uint uVar19;
  ulong uVar20;
  bool bVar21;
  hwaddr hVar22;
  ulong local_68;
  undefined4 local_5c;
  byte *local_58;
  ram_addr_t local_50;
  undefined4 local_44;
  ulong *local_40;
  hwaddr l;
  
  uVar20 = vaddr & 0xfffffffffffff000;
  uVar16 = asc >> 0x2e | uVar20 | (ulong)(rw != 1) * 0x400 + 0x400;
  *tec = uVar16;
  *flags = 7;
  uVar17 = (uint)vaddr;
  if ((vaddr < 0x2000) && ((env->cregs[0] & 0x10000000) != 0)) {
    if (((env->psw).mask & 0x400000000000000) != 0) {
      if (asc == 0) {
        lVar18 = 0x378;
      }
      else if (asc == 0xc00000000000) {
        lVar18 = 0x3d8;
      }
      else {
        if (asc != 0x800000000000) {
          exit(1);
        }
        lVar18 = 0x3a8;
      }
      if ((*(byte *)((long)env->regs + lVar18 + 1) & 1) != 0) goto LAB_00cb9489;
    }
    *flags = 0x47;
    if ((rw == 1) && (vaddr < 0x200 || (uVar17 & 0x1e00) == 0x1000)) {
      *tec = uVar16 | 0x80;
      return 4;
    }
  }
LAB_00cb9489:
  if (((env->psw).mask & 0x400000000000000) == 0) {
    *raddr = uVar20;
    goto LAB_00cb9c82;
  }
  uVar16 = *(ulong *)((long)env->regs + *(long *)(&DAT_00dbec40 + (asc << 0x12 | asc >> 0x2e) * 8));
  bVar21 = true;
  local_40 = raddr;
  if ((env->cregs[0] & 0x800000) == 0) {
    local_44 = 0;
    local_5c = (undefined4)
               CONCAT71((int7)((ulong)*(long *)(&DAT_00dbec40 + (asc << 0x12 | asc >> 0x2e) * 8) >>
                              8),1);
  }
  else {
    _Var8 = s390_has_feat(env->uc,S390_FEAT_EDAT);
    if (_Var8) {
      _Var8 = s390_has_feat(env->uc,S390_FEAT_EDAT_2);
      local_44 = (undefined4)CONCAT71(extraout_var_00,_Var8);
      local_5c = 0;
    }
    else {
      local_44 = 0;
      local_5c = (undefined4)CONCAT71(extraout_var,1);
    }
  }
  raddr = local_40;
  if ((env->cregs[0] & 0x100000) != 0) {
    _Var8 = s390_has_feat(env->uc,S390_FEAT_INSTRUCTION_EXEC_PROT);
    bVar21 = !_Var8;
  }
  if ((uVar16 & 0x20) == 0) {
    uVar19 = (uint)uVar16;
    uVar13 = uVar19 & 3;
    uVar20 = uVar16 & 0xfffffffffffff000;
    uVar15 = (uint)(vaddr >> 0x20);
    local_58 = (byte *)flags;
    switch((uint)(uVar16 >> 2) & 3) {
    case 0:
      if (0x7fffffff < vaddr) {
        return 0x38;
      }
      if ((ulong)uVar13 < vaddr >> 0x1d) {
        return 0x10;
      }
      goto LAB_00cb962f;
    case 1:
      if (vaddr >> 0x2a != 0) {
        return 0x38;
      }
      if (uVar13 < uVar15 >> 8) {
        return 0x3b;
      }
      goto LAB_00cb9840;
    case 2:
      if (vaddr >> 0x35 != 0) {
        return 0x38;
      }
      if (uVar13 < uVar15 >> 0x13) {
        return 0x3a;
      }
      break;
    case 3:
      if (uVar13 < uVar15 >> 0x1e) {
        return 0x39;
      }
      hVar22 = uVar20 + (vaddr >> 0x35) * 8;
      lVar18 = *(long *)(env[-0x1e].aregs + 2);
      pFVar1 = *(FlatView **)(lVar18 + 8);
      l = 8;
      pMVar10 = flatview_translate_s390x
                          (*(uc_struct_conflict14 **)(lVar18 + 0x30),pFVar1,hVar22,&local_50,&l,
                           false,(MemTxAttrs)0x1);
      if ((l == 8) && (pMVar10->ram == true)) {
        puVar11 = (ulong *)qemu_map_ram_ptr_s390x
                                     ((uc_struct_conflict14 *)pMVar10->uc,pMVar10->ram_block,
                                      local_50);
        local_68 = *puVar11;
      }
      else {
        MVar9 = flatview_read_continue_s390x
                          (*(uc_struct_conflict14 **)(lVar18 + 0x30),pFVar1,hVar22,(MemTxAttrs)0x1,
                           &local_68,8,local_50,l,pMVar10);
        if (MVar9 != 0) {
          return 5;
        }
      }
      uVar12 = local_68 >> 0x38;
      uVar2 = (local_68 & 0xff000000000000) >> 0x28;
      uVar3 = (local_68 & 0xff0000000000) >> 0x18;
      uVar4 = (local_68 & 0xff00000000) >> 8;
      uVar16 = uVar12 | uVar2 | uVar3 | uVar4;
      uVar5 = (local_68 & 0xff000000) << 8;
      uVar6 = (local_68 & 0xff0000) << 0x18;
      uVar7 = (local_68 & 0xff00) << 0x28;
      uVar20 = local_68 << 0x38;
      local_68 = uVar16 | uVar5 | uVar6 | uVar7 | uVar20;
      if ((uVar12 & 0x20) != 0) {
        return 0x39;
      }
      uVar13 = (uint)uVar16;
      if ((~uVar13 & 0xc) != 0) {
        return 0x12;
      }
      uVar14 = uVar15 >> 0x13 & 3;
      if ((uVar13 & 3) < uVar14) {
        return 0x3a;
      }
      if (uVar14 < ((uint)(uVar16 >> 6) & 3)) {
        return 0x3a;
      }
      if ((uVar13 >> 9 & 1) != 0 && (char)local_5c == '\0') {
        *local_58 = *local_58 & 0xfd;
      }
      uVar20 = uVar2 & 0xfffffffffffff000 | uVar3 | uVar4 | uVar5 | uVar6 | uVar7 | uVar20;
    }
    hVar22 = (uVar15 >> 7 & 0x3ff8) + uVar20;
    lVar18 = *(long *)(env[-0x1e].aregs + 2);
    pFVar1 = *(FlatView **)(lVar18 + 8);
    l = 8;
    pMVar10 = flatview_translate_s390x
                        (*(uc_struct_conflict14 **)(lVar18 + 0x30),pFVar1,hVar22,&local_50,&l,false,
                         (MemTxAttrs)0x1);
    if ((l == 8) && (pMVar10->ram == true)) {
      puVar11 = (ulong *)qemu_map_ram_ptr_s390x
                                   ((uc_struct_conflict14 *)pMVar10->uc,pMVar10->ram_block,local_50)
      ;
      local_68 = *puVar11;
    }
    else {
      MVar9 = flatview_read_continue_s390x
                        (*(uc_struct_conflict14 **)(lVar18 + 0x30),pFVar1,hVar22,(MemTxAttrs)0x1,
                         &local_68,8,local_50,l,pMVar10);
      if (MVar9 != 0) {
        return 5;
      }
    }
    uVar12 = local_68 >> 0x38;
    uVar2 = (local_68 & 0xff000000000000) >> 0x28;
    uVar3 = (local_68 & 0xff0000000000) >> 0x18;
    uVar4 = (local_68 & 0xff00000000) >> 8;
    uVar16 = uVar12 | uVar2 | uVar3 | uVar4;
    uVar5 = (local_68 & 0xff000000) << 8;
    uVar6 = (local_68 & 0xff0000) << 0x18;
    uVar7 = (local_68 & 0xff00) << 0x28;
    uVar20 = local_68 << 0x38;
    local_68 = uVar16 | uVar5 | uVar6 | uVar7 | uVar20;
    if ((uVar12 & 0x20) != 0) {
      return 0x3a;
    }
    uVar13 = (uint)uVar16;
    if ((uVar13 & 0xc) != 8) {
      return 0x12;
    }
    uVar15 = uVar15 >> 8 & 3;
    if ((uVar13 & 3) < uVar15) {
      return 0x3b;
    }
    if (uVar15 < ((uint)(uVar16 >> 6) & 3)) {
      return 0x3b;
    }
    if ((uVar13 >> 9 & 1) != 0 && (char)local_5c == '\0') {
      *local_58 = *local_58 & 0xfd;
    }
    uVar20 = uVar2 & 0xfffffffffffff000 | uVar3 | uVar4 | uVar5 | uVar6 | uVar7 | uVar20;
LAB_00cb9840:
    hVar22 = ((uint)(vaddr >> 0x1c) & 0x3ff8) + uVar20;
    lVar18 = *(long *)(env[-0x1e].aregs + 2);
    pFVar1 = *(FlatView **)(lVar18 + 8);
    l = 8;
    pMVar10 = flatview_translate_s390x
                        (*(uc_struct_conflict14 **)(lVar18 + 0x30),pFVar1,hVar22,&local_50,&l,false,
                         (MemTxAttrs)0x1);
    if ((l == 8) && (pMVar10->ram == true)) {
      puVar11 = (ulong *)qemu_map_ram_ptr_s390x
                                   ((uc_struct_conflict14 *)pMVar10->uc,pMVar10->ram_block,local_50)
      ;
      local_68 = *puVar11;
    }
    else {
      MVar9 = flatview_read_continue_s390x
                        (*(uc_struct_conflict14 **)(lVar18 + 0x30),pFVar1,hVar22,(MemTxAttrs)0x1,
                         &local_68,8,local_50,l,pMVar10);
      if (MVar9 != 0) {
        return 5;
      }
    }
    uVar16 = local_68 >> 0x38;
    uVar2 = (local_68 & 0xff000000000000) >> 0x28;
    uVar3 = (local_68 & 0xff0000000000) >> 0x18;
    uVar4 = (local_68 & 0xff00000000) >> 8;
    uVar12 = uVar16 | uVar2 | uVar3 | uVar4;
    uVar5 = (local_68 & 0xff000000) << 8;
    uVar6 = (local_68 & 0xff0000) << 0x18;
    uVar7 = (local_68 & 0xff00) << 0x28;
    uVar20 = local_68 << 0x38;
    local_68 = uVar12 | uVar5 | uVar6 | uVar7 | uVar20;
    if ((uVar16 & 0x20) != 0) {
      return 0x3b;
    }
    uVar15 = (uint)uVar12;
    if ((uVar15 & 0xc) != 4) {
      return 0x12;
    }
    if ((((char)local_44 != '\0') && ((uVar19 >> 8 & 1) != 0)) && ((uVar16 & 0x10) != 0)) {
      return 0x12;
    }
    if ((uVar15 >> 9 & 1) != 0 && (char)local_5c == '\0') {
      *local_58 = *local_58 & 0xfd;
    }
    if ((char)local_44 == '\x01' && (uVar15 >> 10 & 1) != 0) {
      if (!bVar21 && (uVar15 >> 8 & 1) != 0) {
        *local_58 = *local_58 & 0xfb;
      }
      uVar20 = uVar4 & 0xffffffff80000000 | uVar5 | uVar6 | uVar7 | uVar20;
      uVar17 = uVar17 & 0x7ffff000;
    }
    else {
      uVar13 = (uint)(vaddr >> 0x1d) & 3;
      if ((uVar15 & 3) < uVar13) {
        return 0x10;
      }
      if (uVar13 < ((uint)(uVar12 >> 6) & 3)) {
        return 0x10;
      }
      uVar20 = uVar2 & 0xfffffffffffff000 | uVar3 | uVar4 | uVar5 | uVar6 | uVar7 | uVar20;
LAB_00cb962f:
      hVar22 = ((uint)(vaddr >> 0x11) & 0x3ff8) + uVar20;
      lVar18 = *(long *)(env[-0x1e].aregs + 2);
      pFVar1 = *(FlatView **)(lVar18 + 8);
      l = 8;
      pMVar10 = flatview_translate_s390x
                          (*(uc_struct_conflict14 **)(lVar18 + 0x30),pFVar1,hVar22,&local_50,&l,
                           false,(MemTxAttrs)0x1);
      if ((l == 8) && (pMVar10->ram == true)) {
        puVar11 = (ulong *)qemu_map_ram_ptr_s390x
                                     ((uc_struct_conflict14 *)pMVar10->uc,pMVar10->ram_block,
                                      local_50);
        local_68 = *puVar11;
      }
      else {
        MVar9 = flatview_read_continue_s390x
                          (*(uc_struct_conflict14 **)(lVar18 + 0x30),pFVar1,hVar22,(MemTxAttrs)0x1,
                           &local_68,8,local_50,l,pMVar10);
        if (MVar9 != 0) {
          return 5;
        }
      }
      uVar16 = local_68 >> 0x38;
      uVar2 = (local_68 & 0xff000000000000) >> 0x28;
      uVar3 = (local_68 & 0xff0000000000) >> 0x18;
      uVar4 = (local_68 & 0xff00000000) >> 8;
      uVar12 = uVar16 | uVar2 | uVar3 | uVar4;
      uVar5 = (local_68 & 0xff000000) << 8;
      uVar6 = (local_68 & 0xff0000) << 0x18;
      uVar7 = (local_68 & 0xff00) << 0x28;
      uVar20 = local_68 << 0x38;
      local_68 = uVar12 | uVar5 | uVar6 | uVar7 | uVar20;
      if ((uVar16 & 0x20) != 0) {
        return 0x10;
      }
      if ((uVar16 & 0xc) != 0) {
        return 0x12;
      }
      uVar15 = (uint)uVar12;
      if (((uVar19 >> 8 & 1) != 0) && ((uVar16 & 0x10) != 0)) {
        return 0x12;
      }
      if ((uVar15 >> 9 & 1) != 0) {
        *local_58 = *local_58 & 0xfd;
      }
      if ((char)local_5c != '\0' || (uVar15 >> 10 & 1) == 0) {
        _Var8 = read_table_entry(*(CPUS390XState_conflict **)(env[-0x1e].aregs + 2),
                                 (ulong)(uVar17 >> 9 & 0x7f8) |
                                 uVar2 & 0xfffffffffffff800 | uVar3 | uVar4 | uVar5 | uVar6 | uVar7
                                 | uVar20,&local_68);
        if (!_Var8) {
          return 5;
        }
        uVar17 = (uint)local_68;
        if ((uVar17 >> 10 & 1) != 0) {
          return 0x11;
        }
        if ((uVar17 >> 0xb & 1) != 0) {
          return 0x12;
        }
        if ((uVar17 >> 9 & 1) != 0) {
          *local_58 = *local_58 & 0xfd;
        }
        if (!bVar21 && (uVar17 >> 8 & 1) != 0) {
          *local_58 = *local_58 & 0xfb;
        }
        uVar20 = local_68 & 0xfffffffffffff000;
        flags = (int *)local_58;
        raddr = local_40;
        goto LAB_00cb9c5c;
      }
      if (!bVar21 && (uVar15 >> 8 & 1) != 0) {
        *local_58 = *local_58 & 0xfb;
      }
      uVar20 = uVar3 & 0xfffffffffff00000 | uVar4 | uVar5 | uVar6 | uVar7 | uVar20;
      uVar17 = uVar17 & 0xff000;
    }
    uVar20 = uVar17 | uVar20;
    flags = (int *)local_58;
    raddr = local_40;
  }
LAB_00cb9c5c:
  *raddr = uVar20;
  if (rw == 1) {
    if ((*(byte *)flags & 2) == 0) {
      *(byte *)tec = (byte)*tec | 4;
      return 4;
    }
  }
  else if ((rw == 2) && ((*(byte *)flags & 4) == 0)) {
    *(byte *)tec = (byte)*tec | 0x84;
    return 4;
  }
LAB_00cb9c82:
  uVar16 = env->psa;
  if (0x1fff < uVar20) {
    uVar12 = 0;
    if (uVar20 < uVar16 + 0x2000) {
      uVar12 = uVar16;
    }
    if (uVar20 < uVar16) {
      uVar12 = 0;
    }
    uVar16 = -uVar12;
  }
  *raddr = uVar16 + uVar20;
  mmu_handle_skey((uc_struct *)env->uc->cpu,uVar16 + uVar20,rw,flags);
  return 0;
}

Assistant:

int mmu_translate(CPUS390XState *env, target_ulong vaddr, int rw, uint64_t asc,
                  target_ulong *raddr, int *flags, uint64_t *tec)
{
    uint64_t asce;
    int r;

    *tec = (vaddr & TARGET_PAGE_MASK) | (asc >> 46) |
            (rw == MMU_DATA_STORE ? FS_WRITE : FS_READ);
    *flags = PAGE_READ | PAGE_WRITE | PAGE_EXEC;

    if (is_low_address(vaddr & TARGET_PAGE_MASK) && lowprot_enabled(env, asc)) {
        /*
         * If any part of this page is currently protected, make sure the
         * TLB entry will not be reused.
         *
         * As the protected range is always the first 512 bytes of the
         * two first pages, we are able to catch all writes to these areas
         * just by looking at the start address (triggering the tlb miss).
         */
        *flags |= PAGE_WRITE_INV;
        if (is_low_address(vaddr) && rw == MMU_DATA_STORE) {
            /* LAP sets bit 56 */
            *tec |= 0x80;
            return PGM_PROTECTION;
        }
    }

    vaddr &= TARGET_PAGE_MASK;

    if (!(env->psw.mask & PSW_MASK_DAT)) {
        *raddr = vaddr;
        goto nodat;
    }

    switch (asc) {
    case PSW_ASC_PRIMARY:
        asce = env->cregs[1];
        break;
    case PSW_ASC_HOME:
        asce = env->cregs[13];
        break;
    case PSW_ASC_SECONDARY:
        asce = env->cregs[7];
        break;
    case PSW_ASC_ACCREG:
    default:
        // hw_error("guest switched to unknown asc mode\n");
        break;
    }

    /* perform the DAT translation */
    r = mmu_translate_asce(env, vaddr, asc, asce, raddr, flags, rw);
    if (unlikely(r)) {
        return r;
    }

    /* check for DAT protection */
    if (unlikely(rw == MMU_DATA_STORE && !(*flags & PAGE_WRITE))) {
        /* DAT sets bit 61 only */
        *tec |= 0x4;
        return PGM_PROTECTION;
    }

    /* check for Instruction-Execution-Protection */
    if (unlikely(rw == MMU_INST_FETCH && !(*flags & PAGE_EXEC))) {
        /* IEP sets bit 56 and 61 */
        *tec |= 0x84;
        return PGM_PROTECTION;
    }

nodat:
    /* Convert real address -> absolute address */
    *raddr = mmu_real2abs(env, *raddr);

    mmu_handle_skey(env->uc, *raddr, rw, flags);
    return 0;
}